

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O2

uint64_t __thiscall TxReconciliationTracker::Impl::PreRegisterPeer(Impl *this,NodeId peer_id)

{
  unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
  *this_00;
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base _Var3;
  _Hash_node_base *p_Var4;
  NodeId NVar5;
  bool bVar6;
  uint64_t uVar7;
  __node_ptr p_Var8;
  __node_ptr p_Var9;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var10;
  ulong uVar11;
  size_type __n;
  ulong uVar12;
  Impl *pIVar13;
  _Hash_node_base _Var14;
  UniqueLock<AnnotatedMixin<std::mutex>_> *this_01;
  long in_FS_OFFSET;
  string_view source_file;
  undefined1 auVar15 [16];
  string_view logging_function;
  NodeId peer_id_local;
  __buckets_alloc_type __alloc;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock12;
  undefined1 local_c0 [8];
  __node_ptr local_b8;
  ChaCha20 local_b0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &criticalblock12;
  pIVar13 = this;
  peer_id_local = peer_id;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (this_01,&this->m_txreconciliation_mutex,"m_txreconciliation_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/txreconciliation.cpp"
             ,0x55,false);
  bVar6 = ::LogAcceptCategory((LogFlags)this_01,(Level)pIVar13);
  if (bVar6) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/txreconciliation.cpp"
    ;
    source_file._M_len = 0x69;
    logging_function._M_str = "PreRegisterPeer";
    logging_function._M_len = 0xf;
    LogPrintFormatInternal<long>
              (logging_function,source_file,0x57,TXRECONCILIATION,Debug,
               (ConstevalFormatString<1U>)0xcb6a5d,&peer_id_local);
  }
  FastRandomContext::FastRandomContext((FastRandomContext *)local_c0,false);
  uVar7 = FastRandomContext::rand64((FastRandomContext *)local_c0);
  ChaCha20::~ChaCha20(&local_b0);
  this_00 = &this->m_states;
  local_c0 = (undefined1  [8])this_00;
  p_Var8 = (__node_ptr)operator_new(0x30);
  NVar5 = peer_id_local;
  (p_Var8->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  (p_Var8->
  super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
  ).
  super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
  ._M_storage._M_storage.__align = (anon_struct_8_0_00000001_for___align)peer_id_local;
  *(uint64_t *)
   ((long)&(p_Var8->
           super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
           ).
           super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
           ._M_storage._M_storage + 8) = uVar7;
  (p_Var8->
  super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
  ).
  super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
  ._M_storage._M_storage.__data[0x20] = '\0';
  uVar12 = (this->m_states)._M_h._M_bucket_count;
  uVar11 = (ulong)peer_id_local % uVar12;
  local_b8 = p_Var8;
  p_Var9 = std::
           _Hashtable<long,_std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar11,
                          (key_type_conflict4 *)
                          &p_Var8->
                           super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                          ,(__hash_code)
                           &p_Var8->
                            super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                         );
  if (p_Var9 == (__node_ptr)0x0) {
    auVar15 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->m_states)._M_h._M_rehash_policy,uVar12,
                         (this->m_states)._M_h._M_element_count);
    __n = auVar15._8_8_;
    if ((auVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s = (this_00->_M_h)._M_buckets;
    }
    else {
      if (__n == 1) {
        __s = &(this->m_states)._M_h._M_single_bucket;
        (this->m_states)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                        (&__alloc,__n);
        memset(__s,0,__n * 8);
      }
      p_Var1 = &(this->m_states)._M_h._M_before_begin;
      _Var3._M_nxt = (this->m_states)._M_h._M_before_begin._M_nxt;
      (this->m_states)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      uVar12 = 0;
LAB_007b7551:
      _Var14._M_nxt = _Var3._M_nxt;
      uVar11 = uVar12;
      if (_Var14._M_nxt != (_Hash_node_base *)0x0) {
        _Var3._M_nxt = (_Var14._M_nxt)->_M_nxt;
        uVar12 = (ulong)_Var14._M_nxt[1]._M_nxt % __n;
        if (__s[uVar12] == (_Hash_node_base *)0x0) goto LAB_007b7582;
        (_Var14._M_nxt)->_M_nxt = __s[uVar12]->_M_nxt;
        pp_Var10 = &__s[uVar12]->_M_nxt;
        uVar12 = uVar11;
        goto LAB_007b75a1;
      }
      std::
      _Hashtable<long,_std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_deallocate_buckets(&this_00->_M_h);
      (this->m_states)._M_h._M_bucket_count = __n;
      (this->m_states)._M_h._M_buckets = __s;
      uVar11 = (ulong)NVar5 % __n;
    }
    if (__s[uVar11] == (_Hash_node_base *)0x0) {
      p_Var4 = (this->m_states)._M_h._M_before_begin._M_nxt;
      (p_Var8->super__Hash_node_base)._M_nxt = p_Var4;
      (this->m_states)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var8;
      if (p_Var4 != (_Hash_node_base *)0x0) {
        __s[(ulong)p_Var4[1]._M_nxt % (this->m_states)._M_h._M_bucket_count] =
             (__node_base_ptr)p_Var8;
        __s = (this->m_states)._M_h._M_buckets;
      }
      __s[uVar11] = &(this->m_states)._M_h._M_before_begin;
    }
    else {
      (p_Var8->super__Hash_node_base)._M_nxt = __s[uVar11]->_M_nxt;
      __s[uVar11]->_M_nxt = (_Hash_node_base *)p_Var8;
    }
    psVar2 = &(this->m_states)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    local_b8 = (__node_ptr)0x0;
  }
  std::
  _Hashtable<long,_std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Scoped_node::~_Scoped_node((_Scoped_node *)local_c0);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock12.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar7;
  }
  __stack_chk_fail();
LAB_007b7582:
  (_Var14._M_nxt)->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = _Var14._M_nxt;
  __s[uVar12] = p_Var1;
  if ((_Var14._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var10 = __s + uVar11;
LAB_007b75a1:
    *pp_Var10 = _Var14._M_nxt;
  }
  goto LAB_007b7551;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);

        LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Pre-register peer=%d\n", peer_id);
        const uint64_t local_salt{FastRandomContext().rand64()};

        // We do this exactly once per peer (which are unique by NodeId, see GetNewNodeId) so it's
        // safe to assume we don't have this record yet.
        Assume(m_states.emplace(peer_id, local_salt).second);
        return local_salt;
    }